

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O3

const_buffer *
booster::aio::details::advance<booster::aio::const_buffer>
          (const_buffer *__return_storage_ptr__,const_buffer *buf,size_t n)

{
  int iVar1;
  pointer peVar2;
  pointer peVar3;
  pointer peVar4;
  long lVar5;
  
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (buf->super_buffer_impl<const_char_*>).size_;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      peVar4 = &(buf->super_buffer_impl<const_char_*>).entry_;
      lVar5 = 1;
    }
    else {
      peVar4 = (buf->super_buffer_impl<const_char_*>).vec_.
               super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(buf->super_buffer_impl<const_char_*>).vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)peVar4 >> 4;
    }
    peVar3 = peVar4;
    if (n != 0 && lVar5 != 0) {
      while( true ) {
        lVar5 = lVar5 + -1;
        peVar3 = peVar4 + 1;
        peVar2 = (pointer)peVar4->size;
        if (n <= peVar2 && (long)peVar2 - n != 0) break;
        if ((lVar5 == 0) || (n = n - (long)peVar2, peVar4 = peVar3, (pointer)n == (pointer)0x0))
        goto joined_r0x0011048a;
      }
      buffer_impl<const_char_*>::add
                (&__return_storage_ptr__->super_buffer_impl<const_char_*>,peVar4->ptr + n,
                 (long)peVar2 - n);
    }
joined_r0x0011048a:
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      buffer_impl<const_char_*>::add
                (&__return_storage_ptr__->super_buffer_impl<const_char_*>,
                 (char *)(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                            *)&peVar3->ptr)->_M_impl).super__Vector_impl_data._M_start,
                 (size_t)peVar3->size);
      peVar3 = peVar3 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Buffer advance(Buffer const &buf,size_t n)
			{
				Buffer res;
				typename Buffer::buffer_data_type data=buf.get();
				while(data.second > 0 && n > 0) {
					if(data.first->size <= n) {
						n-= data.first->size;
						data.second--;
						data.first++;
					}
					else {
						res.add(data.first->ptr + n,data.first->size - n);
						n=0;
						data.second--;
						data.first++;
					}
				}
				while(data.second > 0) {
					res.add(data.first->ptr,data.first->size);
					data.second--;
					data.first++;
				}
				return res;
			}